

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsCommon.cpp
# Opt level: O3

void Scs::LogWriteLine(char *format,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  unique_lock<std::mutex> lock;
  va_list argptr;
  char buffer [1024];
  char *local_500;
  unique_lock<std::mutex> local_4f8;
  undefined8 local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [8];
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  char local_418 [1024];
  
  if (in_AL != '\0') {
    local_498 = in_XMM0_Qa;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  local_4f8._M_device = &s_mutex;
  local_4f8._M_owns = false;
  local_4c0 = in_RSI;
  local_4b8 = in_RDX;
  local_4b0 = in_RCX;
  local_4a8 = in_R8;
  local_4a0 = in_R9;
  std::unique_lock<std::mutex>::lock(&local_4f8);
  local_4f8._M_owns = true;
  local_4e0 = &stack0x00000008;
  local_4e8 = 0x3000000008;
  local_4d8 = local_4c8;
  vsnprintf(local_418,0x400,format,&local_4e8);
  sVar1 = strlen(local_418);
  if (sVar1 < 0x3fe) {
    (local_418 + sVar1)[0] = '\n';
    (local_418 + sVar1)[1] = '\0';
  }
  local_500 = local_418;
  if (s_params.logFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*s_params.logFn._M_invoker)((_Any_data *)&s_params,&local_500);
    std::unique_lock<std::mutex>::~unique_lock(&local_4f8);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void Scs::LogWriteLine(const char * format, ...)
{
	std::unique_lock<std::mutex> lock(s_mutex);
	va_list argptr;
	va_start(argptr, format);
	char buffer[BufferSize];
#if defined(SCS_WINDOWS)
	_vsnprintf_s(buffer, BufferSize, _TRUNCATE, format, argptr);
#else
	vsnprintf(buffer, BufferSize, format, argptr);
#endif
	size_t len = strlen(buffer);
	if (len < BufferSize - 2)
	{
		buffer[len] = '\n';
		buffer[len + 1] = 0;
	}
	s_params.logFn(buffer);
	va_end(argptr);
}